

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O0

void __thiscall
spirv_cross::CompilerMSL::add_plain_member_variable_to_interface_block
          (CompilerMSL *this,StorageClass storage,string *ib_var_ref,SPIRType *ib_type,
          SPIRVariable *var,SPIRType *var_type,uint32_t mbr_idx,InterfaceBlockMeta *meta,
          string *mbr_name_qual,string *var_chain_qual,uint32_t *location,uint32_t *var_mbr_idx)

{
  bool bVar1;
  bool bVar2;
  uint32_t uVar3;
  TypedID<(spirv_cross::Types)1> TVar4;
  uint32_t uVar5;
  uint32_t value;
  TypedID *this_00;
  size_t sVar6;
  TypedID<(spirv_cross::Types)1> *pTVar7;
  size_type sVar8;
  bool *pbVar9;
  size_type sVar10;
  mapped_type *pmVar11;
  SPIRType *pSVar12;
  Vector<std::function<void_()>_> *pVVar13;
  bool local_54b;
  bool local_54a;
  bool local_549;
  bool local_53d;
  uint32_t local_52c;
  anon_class_56_4_6b62cf2f local_528;
  function<void_()> local_4f0;
  anon_class_376_4_54ccc45b local_4d0;
  function<void_()> local_358;
  TypedID<(spirv_cross::Types)0> local_334;
  SPIRConstant *local_330;
  SPIRConstant *c;
  uint32_t local_320;
  uint32_t local_31c;
  uint32_t local_318;
  uint32_t comp;
  anon_class_72_3_6051d170 local_310;
  function<void_()> local_2c8;
  anon_class_80_4_51340e48 local_2a8;
  function<void_()> local_258;
  undefined1 local_238 [64];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f8 [8];
  string var_chain;
  TypedID<(spirv_cross::Types)1> local_1d4;
  TypedID<(spirv_cross::Types)1> TStack_1d0;
  bool flatten_stage_out;
  uint32_t local_1cc;
  uint32_t local_1c8;
  uint32_t local_1c4;
  uint32_t local_1c0;
  uint32_t orig_mbr_type_id;
  uint32_t component;
  BuiltIn local_1b4;
  BuiltIn local_1b0;
  uint32_t local_1ac;
  uint32_t local_1a8;
  uint32_t local_1a4;
  uint32_t orig_vecsize;
  uint32_t local_19c;
  bool has_var_loc_decor;
  uint32_t local_194;
  undefined1 local_190 [3];
  bool has_member_loc_decor;
  uint32_t ir_location;
  spirv_cross local_170 [36];
  uint32_t local_14c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128 [8];
  string qual_var_name;
  allocator local_f1;
  string local_f0 [32];
  undefined1 local_d0 [32];
  undefined1 local_b0 [8];
  string mbr_name;
  TypedID<(spirv_cross::Types)1> local_8c;
  TypedID<(spirv_cross::Types)1> local_88;
  uint32_t local_84;
  TypedID<(spirv_cross::Types)1> local_80;
  uint32_t local_7c;
  uint32_t local_78;
  uint32_t ib_mbr_idx;
  uint32_t mbr_type_id;
  bool local_69;
  uint32_t local_68;
  TypedID<(spirv_cross::Types)1> TStack_64;
  bool is_sample;
  bool local_5d;
  uint32_t local_5c;
  TypedID<(spirv_cross::Types)1> TStack_58;
  bool is_centroid;
  bool local_51;
  uint32_t local_50;
  TypedID<(spirv_cross::Types)1> TStack_4c;
  bool is_noperspective;
  bool local_46;
  byte local_45;
  BuiltIn local_44;
  bool is_flat;
  bool is_builtin;
  SPIRFunction *pSStack_40;
  BuiltIn builtin;
  SPIRFunction *entry_func;
  SPIRType *var_type_local;
  SPIRVariable *var_local;
  SPIRType *ib_type_local;
  string *ib_var_ref_local;
  CompilerMSL *pCStack_10;
  StorageClass storage_local;
  CompilerMSL *this_local;
  
  entry_func = (SPIRFunction *)var_type;
  var_type_local = (SPIRType *)var;
  var_local = (SPIRVariable *)ib_type;
  ib_type_local = (SPIRType *)ib_var_ref;
  ib_var_ref_local._4_4_ = storage;
  pCStack_10 = this;
  uVar3 = TypedID::operator_cast_to_unsigned_int
                    ((TypedID *)&(this->super_CompilerGLSL).super_Compiler.ir.default_entry_point);
  pSStack_40 = Compiler::get<spirv_cross::SPIRFunction>((Compiler *)this,uVar3);
  local_44 = BuiltInMax;
  local_45 = Compiler::is_member_builtin((Compiler *)this,(SPIRType *)entry_func,mbr_idx,&local_44);
  TStack_4c = TypedID::operator_cast_to_TypedID((TypedID *)&(entry_func->super_IVariant).self);
  bVar1 = Compiler::has_member_decoration
                    ((Compiler *)this,(TypeID)TStack_4c.id,mbr_idx,DecorationFlat);
  local_53d = true;
  if (!bVar1) {
    local_50 = (var_type_local->super_IVariant).self.id;
    local_53d = Compiler::has_decoration((Compiler *)this,(ID)local_50,DecorationFlat);
  }
  local_46 = local_53d;
  TStack_58 = TypedID::operator_cast_to_TypedID((TypedID *)&(entry_func->super_IVariant).self);
  bVar1 = Compiler::has_member_decoration
                    ((Compiler *)this,(TypeID)TStack_58.id,mbr_idx,DecorationNoPerspective);
  local_549 = true;
  if (!bVar1) {
    local_5c = (var_type_local->super_IVariant).self.id;
    local_549 = Compiler::has_decoration((Compiler *)this,(ID)local_5c,DecorationNoPerspective);
  }
  local_51 = local_549;
  TStack_64 = TypedID::operator_cast_to_TypedID((TypedID *)&(entry_func->super_IVariant).self);
  bVar1 = Compiler::has_member_decoration
                    ((Compiler *)this,(TypeID)TStack_64.id,mbr_idx,DecorationCentroid);
  local_54a = true;
  if (!bVar1) {
    local_68 = (var_type_local->super_IVariant).self.id;
    local_54a = Compiler::has_decoration((Compiler *)this,(ID)local_68,DecorationCentroid);
  }
  local_5d = local_54a;
  mbr_type_id = (uint32_t)
                TypedID::operator_cast_to_TypedID((TypedID *)&(entry_func->super_IVariant).self);
  bVar1 = Compiler::has_member_decoration
                    ((Compiler *)this,(TypeID)mbr_type_id,mbr_idx,DecorationSample);
  local_54b = true;
  if (!bVar1) {
    ib_mbr_idx = (var_type_local->super_IVariant).self.id;
    local_54b = Compiler::has_decoration((Compiler *)this,(ID)ib_mbr_idx,DecorationSample);
  }
  local_69 = local_54b;
  this_00 = (TypedID *)
            VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>::operator[]
                      ((VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_> *)
                       ((entry_func->arguments).stack_storage.aligned_char + 0x68),(ulong)mbr_idx);
  local_78 = TypedID::operator_cast_to_unsigned_int(this_00);
  sVar6 = VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>::size
                    ((VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_> *)
                     &var_local->deferred_declaration);
  local_7c = (uint32_t)sVar6;
  local_78 = ensure_correct_builtin_type(this,local_78,local_44);
  TypedID<(spirv_cross::Types)1>::TypedID(&local_80,local_78);
  pTVar7 = VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>::operator[]
                     ((VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_> *)
                      ((entry_func->arguments).stack_storage.aligned_char + 0x68),(ulong)mbr_idx);
  pTVar7->id = local_80.id;
  bVar1 = false;
  if (ib_var_ref_local._4_4_ == StorageClassInput) {
    local_84 = TypedID::operator_cast_to_unsigned_int
                         ((TypedID *)&(var_type_local->super_IVariant).self);
    sVar8 = ::std::
            unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
            ::count(&this->pull_model_inputs,&local_84);
    bVar1 = sVar8 != 0;
  }
  if (bVar1) {
    pbVar9 = &var_local->deferred_declaration;
    uVar3 = build_msl_interpolant_type(this,local_78,(bool)(local_51 & 1));
    TypedID<(spirv_cross::Types)1>::TypedID(&local_88,uVar3);
    SmallVector<spirv_cross::TypedID<(spirv_cross::Types)1>,_8UL>::push_back
              ((SmallVector<spirv_cross::TypedID<(spirv_cross::Types)1>,_8UL> *)pbVar9,&local_88);
  }
  else {
    pbVar9 = &var_local->deferred_declaration;
    TypedID<(spirv_cross::Types)1>::TypedID(&local_8c,local_78);
    SmallVector<spirv_cross::TypedID<(spirv_cross::Types)1>,_8UL>::push_back
              ((SmallVector<spirv_cross::TypedID<(spirv_cross::Types)1>,_8UL> *)pbVar9,&local_8c);
  }
  append_member_name((CompilerMSL *)local_d0,(string *)this,(SPIRType *)mbr_name_qual,
                     (uint32_t)entry_func);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string(local_f0,"m",&local_f1);
  ensure_valid_name((CompilerMSL *)local_b0,(string *)this,(string *)local_d0);
  ::std::__cxx11::string::~string(local_f0);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_f1);
  ::std::__cxx11::string::~string((string *)local_d0);
  TVar4 = TypedID::operator_cast_to_TypedID((TypedID *)&(var_local->super_IVariant).self);
  Compiler::set_member_name((Compiler *)this,(TypeID)TVar4.id,local_7c,(string *)local_b0);
  ::std::operator+(local_148,(char *)ib_type_local);
  ::std::operator+(local_128,local_148);
  ::std::__cxx11::string::~string((string *)local_148);
  bVar1 = false;
  if (ib_var_ref_local._4_4_ == StorageClassInput) {
    local_14c = TypedID::operator_cast_to_unsigned_int
                          ((TypedID *)&(var_type_local->super_IVariant).self);
    sVar8 = ::std::
            unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
            ::count(&this->pull_model_inputs,&local_14c);
    bVar1 = sVar8 != 0;
  }
  if (bVar1) {
    if ((local_5d & 1U) == 0) {
      if ((local_69 & 1U) == 0) {
        ::std::__cxx11::string::operator+=((string *)local_128,".interpolate_at_center()");
      }
      else {
        CompilerGLSL::to_expression_abi_cxx11_
                  ((CompilerGLSL *)local_190,(uint32_t)this,SUB41(this->builtin_sample_id_id,0));
        join<char_const(&)[24],std::__cxx11::string,char_const(&)[2]>
                  (local_170,(char (*) [24])".interpolate_at_sample(",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_190,
                   (char (*) [2])0x40bd22);
        ::std::__cxx11::string::operator+=((string *)local_128,(string *)local_170);
        ::std::__cxx11::string::~string((string *)local_170);
        ::std::__cxx11::string::~string((string *)local_190);
      }
    }
    else {
      ::std::__cxx11::string::operator+=((string *)local_128,".interpolate_at_centroid()");
    }
  }
  local_194 = 0xffffffff;
  local_19c = (uint32_t)
              TypedID::operator_cast_to_TypedID((TypedID *)&(entry_func->super_IVariant).self);
  has_var_loc_decor =
       Compiler::has_member_decoration
                 ((Compiler *)this,(TypeID)local_19c,mbr_idx,DecorationLocation);
  local_1a4 = (var_type_local->super_IVariant).self.id;
  orig_vecsize._3_1_ = Compiler::has_decoration((Compiler *)this,(ID)local_1a4,DecorationLocation);
  local_1a8 = 0xffffffff;
  if ((has_var_loc_decor & 1U) == 0) {
    if ((bool)orig_vecsize._3_1_) {
      local_194 = CompilerGLSL::get_accumulated_member_location
                            (&this->super_CompilerGLSL,(SPIRVariable *)var_type_local,mbr_idx,
                             (bool)(meta->strip_array & 1));
    }
    else if ((local_45 & 1) != 0) {
      bVar2 = Compiler::is_tessellation_shader((Compiler *)this);
      bVar1 = false;
      if ((bVar2) && (bVar1 = false, ib_var_ref_local._4_4_ == StorageClassInput)) {
        local_1b0 = local_44;
        sVar10 = ::std::
                 unordered_map<unsigned_int,_spirv_cross::MSLShaderInterfaceVariable,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spirv_cross::MSLShaderInterfaceVariable>_>_>
                 ::count(&this->inputs_by_builtin,&local_1b0);
        bVar1 = sVar10 != 0;
      }
      if (bVar1) {
        local_1b4 = local_44;
        pmVar11 = ::std::
                  unordered_map<unsigned_int,_spirv_cross::MSLShaderInterfaceVariable,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spirv_cross::MSLShaderInterfaceVariable>_>_>
                  ::operator[](&this->inputs_by_builtin,&local_1b4);
        local_194 = pmVar11->location;
      }
      else {
        bVar1 = false;
        if (((this->capture_output_to_buffer & 1U) != 0) &&
           (bVar1 = false, ib_var_ref_local._4_4_ == StorageClassOutput)) {
          component = local_44;
          sVar10 = ::std::
                   unordered_map<unsigned_int,_spirv_cross::MSLShaderInterfaceVariable,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spirv_cross::MSLShaderInterfaceVariable>_>_>
                   ::count(&this->outputs_by_builtin,&component);
          bVar1 = sVar10 != 0;
        }
        if (bVar1) {
          orig_mbr_type_id = local_44;
          pmVar11 = ::std::
                    unordered_map<unsigned_int,_spirv_cross::MSLShaderInterfaceVariable,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spirv_cross::MSLShaderInterfaceVariable>_>_>
                    ::operator[](&this->outputs_by_builtin,&orig_mbr_type_id);
          local_194 = pmVar11->location;
        }
      }
    }
  }
  else {
    local_1ac = (uint32_t)
                TypedID::operator_cast_to_TypedID((TypedID *)&(entry_func->super_IVariant).self);
    local_194 = Compiler::get_member_decoration
                          ((Compiler *)this,(TypeID)local_1ac,mbr_idx,DecorationLocation);
  }
  if ((*location == 0xffffffff) && (local_194 != 0xffffffff)) {
    *location = local_194;
  }
  if ((ib_var_ref_local._4_4_ == StorageClassInput) &&
     (((has_var_loc_decor & 1U) != 0 || ((orig_vecsize._3_1_ & 1) != 0)))) {
    local_1c0 = 0;
    local_1c4 = local_78;
    if ((has_var_loc_decor & 1U) != 0) {
      local_1c8 = (uint32_t)
                  TypedID::operator_cast_to_TypedID((TypedID *)&(entry_func->super_IVariant).self);
      local_1c0 = Compiler::get_member_decoration
                            ((Compiler *)this,(TypeID)local_1c8,mbr_idx,DecorationComponent);
    }
    local_78 = ensure_correct_input_type
                         (this,local_78,*location,local_1c0,0,(bool)(meta->strip_array & 1));
    if (local_78 != local_1c4) {
      pSVar12 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,local_1c4);
      local_1a8 = pSVar12->vecsize;
    }
    bVar1 = false;
    if (ib_var_ref_local._4_4_ == StorageClassInput) {
      local_1cc = TypedID::operator_cast_to_unsigned_int
                            ((TypedID *)&(var_type_local->super_IVariant).self);
      sVar8 = ::std::
              unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
              ::count(&this->pull_model_inputs,&local_1cc);
      bVar1 = sVar8 != 0;
    }
    if (bVar1) {
      uVar3 = build_msl_interpolant_type(this,local_78,(bool)(local_51 & 1));
      TypedID<(spirv_cross::Types)1>::TypedID(&stack0xfffffffffffffe30,uVar3);
      pTVar7 = VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>::operator[]
                         ((VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_> *)
                          &var_local->deferred_declaration,(ulong)local_7c);
      pTVar7->id = TStack_1d0.id;
    }
    else {
      TypedID<(spirv_cross::Types)1>::TypedID(&local_1d4,local_78);
      pTVar7 = VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>::operator[]
                         ((VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_> *)
                          &var_local->deferred_declaration,(ulong)local_7c);
      pTVar7->id = local_1d4.id;
    }
  }
  bVar1 = false;
  ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (local_238 + 0x20),(char *)var_chain_qual);
  CompilerGLSL::to_member_name_abi_cxx11_
            ((CompilerGLSL *)local_238,(SPIRType *)this,(uint32_t)entry_func);
  ::std::operator+(local_1f8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (local_238 + 0x20));
  ::std::__cxx11::string::~string((string *)local_238);
  ::std::__cxx11::string::~string((string *)(local_238 + 0x20));
  if (((local_45 & 1) == 0) || ((meta->strip_array & 1U) != 0)) {
    if (((meta->strip_array & 1U) == 0) && ((meta->allow_local_declaration & 1U) != 0)) {
      if (ib_var_ref_local._4_4_ == StorageClassInput) {
        pVVar13 = &pSStack_40->fixup_hooks_in;
        local_2a8.orig_vecsize = local_1a8;
        local_2a8.this = this;
        ::std::__cxx11::string::string((string *)&local_2a8.var_chain,(string *)local_1f8);
        ::std::__cxx11::string::string((string *)&local_2a8.qual_var_name,(string *)local_128);
        ::std::function<void()>::
        function<spirv_cross::CompilerMSL::add_plain_member_variable_to_interface_block(spv::StorageClass,std::__cxx11::string_const&,spirv_cross::SPIRType&,spirv_cross::SPIRVariable&,spirv_cross::SPIRType&,unsigned_int,spirv_cross::CompilerMSL::InterfaceBlockMeta&,std::__cxx11::string_const&,std::__cxx11::string_const&,unsigned_int&,unsigned_int&)::__0,void>
                  ((function<void()> *)&local_258,&local_2a8);
        SmallVector<std::function<void_()>,_0UL>::push_back(pVVar13,&local_258);
        ::std::function<void_()>::~function(&local_258);
        add_plain_member_variable_to_interface_block(spv::StorageClass,std::__cxx11::string_const&,spirv_cross::SPIRType&,spirv_cross::SPIRVariable&,spirv_cross::SPIRType&,unsigned_int,spirv_cross::CompilerMSL::InterfaceBlockMeta&,std::__cxx11::string_const&,std::__cxx11::string_const&,unsigned_int&,unsigned_int&)
        ::$_0::~__0((__0 *)&local_2a8);
      }
      else if (ib_var_ref_local._4_4_ == StorageClassOutput) {
        bVar1 = true;
        pVVar13 = &pSStack_40->fixup_hooks_out;
        local_310.this = this;
        ::std::__cxx11::string::string((string *)&local_310.qual_var_name,(string *)local_128);
        ::std::__cxx11::string::string((string *)&local_310.var_chain,(string *)local_1f8);
        ::std::function<void()>::
        function<spirv_cross::CompilerMSL::add_plain_member_variable_to_interface_block(spv::StorageClass,std::__cxx11::string_const&,spirv_cross::SPIRType&,spirv_cross::SPIRVariable&,spirv_cross::SPIRType&,unsigned_int,spirv_cross::CompilerMSL::InterfaceBlockMeta&,std::__cxx11::string_const&,std::__cxx11::string_const&,unsigned_int&,unsigned_int&)::__1,void>
                  ((function<void()> *)&local_2c8,&local_310);
        SmallVector<std::function<void_()>,_0UL>::push_back(pVVar13,&local_2c8);
        ::std::function<void_()>::~function(&local_2c8);
        add_plain_member_variable_to_interface_block(spv::StorageClass,std::__cxx11::string_const&,spirv_cross::SPIRType&,spirv_cross::SPIRVariable&,spirv_cross::SPIRType&,unsigned_int,spirv_cross::CompilerMSL::InterfaceBlockMeta&,std::__cxx11::string_const&,std::__cxx11::string_const&,unsigned_int&,unsigned_int&)
        ::$_1::~__1((__1 *)&local_310);
      }
    }
  }
  else {
    uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(entry_func->super_IVariant).self);
    Compiler::set_member_qualified_name((Compiler *)this,uVar3,mbr_idx,local_128);
  }
  if ((((local_45 & 1) == 0) && (*location != 0xffffffff)) ||
     (((local_45 & 1) != 0 && (local_194 != 0xffffffff)))) {
    comp = (uint32_t)TypedID::operator_cast_to_TypedID((TypedID *)&(var_local->super_IVariant).self)
    ;
    Compiler::set_member_decoration
              ((Compiler *)this,(TypeID)comp,local_7c,DecorationLocation,*location);
    uVar3 = *location;
    pSVar12 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,local_78);
    mark_location_as_used_by_shader(this,uVar3,pSVar12,ib_var_ref_local._4_4_,false);
    pSVar12 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,local_78);
    uVar3 = CompilerGLSL::type_to_location_count(&this->super_CompilerGLSL,pSVar12);
    *location = uVar3 + *location;
  }
  local_318 = (uint32_t)
              TypedID::operator_cast_to_TypedID((TypedID *)&(entry_func->super_IVariant).self);
  bVar2 = Compiler::has_member_decoration
                    ((Compiler *)this,(TypeID)local_318,mbr_idx,DecorationComponent);
  if (bVar2) {
    local_320 = (uint32_t)
                TypedID::operator_cast_to_TypedID((TypedID *)&(entry_func->super_IVariant).self);
    local_31c = Compiler::get_member_decoration
                          ((Compiler *)this,(TypeID)local_320,mbr_idx,DecorationComponent);
    c._4_4_ = TypedID::operator_cast_to_TypedID((TypedID *)&(var_local->super_IVariant).self);
    Compiler::set_member_decoration
              ((Compiler *)this,(TypeID)c._4_4_,local_7c,DecorationComponent,local_31c);
  }
  if ((local_45 & 1) != 0) {
    c._0_4_ = TypedID::operator_cast_to_TypedID((TypedID *)&(var_local->super_IVariant).self);
    Compiler::set_member_decoration
              ((Compiler *)this,(TypeID)c._0_4_,local_7c,DecorationBuiltIn,local_44);
    if ((local_44 == BuiltInPosition) && (ib_var_ref_local._4_4_ == StorageClassOutput)) {
      ::std::__cxx11::string::operator=((string *)&this->qual_pos_var_name,(string *)local_128);
    }
  }
  local_330 = (SPIRConstant *)0x0;
  bVar2 = false;
  if ((!bVar1) && (bVar2 = false, var_type_local->basetype == SByte)) {
    uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)&var_type_local->vecsize);
    TypedID<(spirv_cross::Types)0>::TypedID(&local_334,0);
    uVar5 = TypedID::operator_cast_to_unsigned_int((TypedID *)&local_334);
    bVar2 = false;
    if (uVar3 != uVar5) {
      uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)&var_type_local->vecsize);
      local_330 = Compiler::maybe_get<spirv_cross::SPIRConstant>((Compiler *)this,uVar3);
      bVar2 = local_330 != (SPIRConstant *)0x0;
    }
  }
  if (bVar2) {
    if ((meta->strip_array & 1U) == 0) {
      pVVar13 = &pSStack_40->fixup_hooks_in;
      local_528.this = this;
      ::std::__cxx11::string::string((string *)&local_528.qual_var_name,(string *)local_128);
      local_528.c = local_330;
      local_528.mbr_idx = mbr_idx;
      ::std::function<void()>::
      function<spirv_cross::CompilerMSL::add_plain_member_variable_to_interface_block(spv::StorageClass,std::__cxx11::string_const&,spirv_cross::SPIRType&,spirv_cross::SPIRVariable&,spirv_cross::SPIRType&,unsigned_int,spirv_cross::CompilerMSL::InterfaceBlockMeta&,std::__cxx11::string_const&,std::__cxx11::string_const&,unsigned_int&,unsigned_int&)::__3,void>
                ((function<void()> *)&local_4f0,&local_528);
      SmallVector<std::function<void_()>,_0UL>::push_back(pVVar13,&local_4f0);
      ::std::function<void_()>::~function(&local_4f0);
      add_plain_member_variable_to_interface_block(spv::StorageClass,std::__cxx11::string_const&,spirv_cross::SPIRType&,spirv_cross::SPIRVariable&,spirv_cross::SPIRType&,unsigned_int,spirv_cross::CompilerMSL::InterfaceBlockMeta&,std::__cxx11::string_const&,std::__cxx11::string_const&,unsigned_int&,unsigned_int&)
      ::$_3::~__3((__3 *)&local_528);
    }
    else {
      pVVar13 = &pSStack_40->fixup_hooks_in;
      local_4d0.var = (SPIRVariable *)var_type_local;
      local_4d0.mbr_idx = mbr_idx;
      local_4d0.this = this;
      SPIRType::SPIRType(&local_4d0.ib_type,(SPIRType *)var_local);
      ::std::function<void()>::
      function<spirv_cross::CompilerMSL::add_plain_member_variable_to_interface_block(spv::StorageClass,std::__cxx11::string_const&,spirv_cross::SPIRType&,spirv_cross::SPIRVariable&,spirv_cross::SPIRType&,unsigned_int,spirv_cross::CompilerMSL::InterfaceBlockMeta&,std::__cxx11::string_const&,std::__cxx11::string_const&,unsigned_int&,unsigned_int&)::__2,void>
                ((function<void()> *)&local_358,&local_4d0);
      SmallVector<std::function<void_()>,_0UL>::push_back(pVVar13,&local_358);
      ::std::function<void_()>::~function(&local_358);
      add_plain_member_variable_to_interface_block(spv::StorageClass,std::__cxx11::string_const&,spirv_cross::SPIRType&,spirv_cross::SPIRVariable&,spirv_cross::SPIRType&,unsigned_int,spirv_cross::CompilerMSL::InterfaceBlockMeta&,std::__cxx11::string_const&,std::__cxx11::string_const&,unsigned_int&,unsigned_int&)
      ::$_2::~__2((__2 *)&local_4d0);
    }
  }
  bVar1 = true;
  if (ib_var_ref_local._4_4_ == StorageClassInput) {
    local_52c = TypedID::operator_cast_to_unsigned_int
                          ((TypedID *)&(var_type_local->super_IVariant).self);
    sVar8 = ::std::
            unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
            ::count(&this->pull_model_inputs,&local_52c);
    bVar1 = sVar8 == 0;
  }
  if (bVar1) {
    if ((local_46 & 1U) != 0) {
      TVar4 = TypedID::operator_cast_to_TypedID((TypedID *)&(var_local->super_IVariant).self);
      Compiler::set_member_decoration((Compiler *)this,(TypeID)TVar4.id,local_7c,DecorationFlat,0);
    }
    if ((local_51 & 1U) != 0) {
      TVar4 = TypedID::operator_cast_to_TypedID((TypedID *)&(var_local->super_IVariant).self);
      Compiler::set_member_decoration
                ((Compiler *)this,(TypeID)TVar4.id,local_7c,DecorationNoPerspective,0);
    }
    if ((local_5d & 1U) != 0) {
      TVar4 = TypedID::operator_cast_to_TypedID((TypedID *)&(var_local->super_IVariant).self);
      Compiler::set_member_decoration
                ((Compiler *)this,(TypeID)TVar4.id,local_7c,DecorationCentroid,0);
    }
    if ((local_69 & 1U) != 0) {
      TVar4 = TypedID::operator_cast_to_TypedID((TypedID *)&(var_local->super_IVariant).self);
      Compiler::set_member_decoration((Compiler *)this,(TypeID)TVar4.id,local_7c,DecorationSample,0)
      ;
    }
  }
  uVar5 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(var_local->super_IVariant).self);
  uVar3 = local_7c;
  value = TypedID::operator_cast_to_unsigned_int((TypedID *)&(var_type_local->super_IVariant).self);
  Compiler::set_extended_member_decoration
            ((Compiler *)this,uVar5,uVar3,SPIRVCrossDecorationInterfaceOrigID,value);
  uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(var_local->super_IVariant).self);
  Compiler::set_extended_member_decoration
            ((Compiler *)this,uVar3,local_7c,SPIRVCrossDecorationInterfaceMemberIndex,*var_mbr_idx);
  ::std::__cxx11::string::~string((string *)local_1f8);
  ::std::__cxx11::string::~string((string *)local_128);
  ::std::__cxx11::string::~string((string *)local_b0);
  return;
}

Assistant:

void CompilerMSL::add_plain_member_variable_to_interface_block(StorageClass storage,
                                                               const string &ib_var_ref, SPIRType &ib_type,
                                                               SPIRVariable &var, SPIRType &var_type,
                                                               uint32_t mbr_idx, InterfaceBlockMeta &meta,
                                                               const string &mbr_name_qual,
                                                               const string &var_chain_qual,
                                                               uint32_t &location, uint32_t &var_mbr_idx)
{
	auto &entry_func = get<SPIRFunction>(ir.default_entry_point);

	BuiltIn builtin = BuiltInMax;
	bool is_builtin = is_member_builtin(var_type, mbr_idx, &builtin);
	bool is_flat =
	    has_member_decoration(var_type.self, mbr_idx, DecorationFlat) || has_decoration(var.self, DecorationFlat);
	bool is_noperspective = has_member_decoration(var_type.self, mbr_idx, DecorationNoPerspective) ||
	                        has_decoration(var.self, DecorationNoPerspective);
	bool is_centroid = has_member_decoration(var_type.self, mbr_idx, DecorationCentroid) ||
	                   has_decoration(var.self, DecorationCentroid);
	bool is_sample =
	    has_member_decoration(var_type.self, mbr_idx, DecorationSample) || has_decoration(var.self, DecorationSample);

	// Add a reference to the member to the interface struct.
	uint32_t mbr_type_id = var_type.member_types[mbr_idx];
	uint32_t ib_mbr_idx = uint32_t(ib_type.member_types.size());
	mbr_type_id = ensure_correct_builtin_type(mbr_type_id, builtin);
	var_type.member_types[mbr_idx] = mbr_type_id;
	if (storage == StorageClassInput && pull_model_inputs.count(var.self))
		ib_type.member_types.push_back(build_msl_interpolant_type(mbr_type_id, is_noperspective));
	else
		ib_type.member_types.push_back(mbr_type_id);

	// Give the member a name
	string mbr_name = ensure_valid_name(append_member_name(mbr_name_qual, var_type, mbr_idx), "m");
	set_member_name(ib_type.self, ib_mbr_idx, mbr_name);

	// Update the original variable reference to include the structure reference
	string qual_var_name = ib_var_ref + "." + mbr_name;
	// If using pull-model interpolation, need to add a call to the correct interpolation method.
	if (storage == StorageClassInput && pull_model_inputs.count(var.self))
	{
		if (is_centroid)
			qual_var_name += ".interpolate_at_centroid()";
		else if (is_sample)
			qual_var_name += join(".interpolate_at_sample(", to_expression(builtin_sample_id_id), ")");
		else
			qual_var_name += ".interpolate_at_center()";
	}

	// The SPIRV location of interface variable, used to obtain the initial
	// MSL location (the location variable) and interface matching
	uint32_t ir_location = UINT32_MAX;
	bool has_member_loc_decor = has_member_decoration(var_type.self, mbr_idx, DecorationLocation);
	bool has_var_loc_decor = has_decoration(var.self, DecorationLocation);
	uint32_t orig_vecsize = UINT32_MAX;

	if (has_member_loc_decor)
		ir_location = get_member_decoration(var_type.self, mbr_idx, DecorationLocation);
	else if (has_var_loc_decor)
		ir_location = get_accumulated_member_location(var, mbr_idx, meta.strip_array);
	else if (is_builtin)
	{
		if (is_tessellation_shader() && storage == StorageClassInput && inputs_by_builtin.count(builtin))
			ir_location = inputs_by_builtin[builtin].location;
		else if (capture_output_to_buffer && storage == StorageClassOutput && outputs_by_builtin.count(builtin))
			ir_location = outputs_by_builtin[builtin].location;
	}

	// Once we determine the location of the first member within nested structures,
	// from a var of the topmost structure, the remaining flattened members of
	// the nested structures will have consecutive location values. At this point,
	// we've recursively tunnelled into structs, arrays, and matrices, and are
	// down to a single location for each member now.
	if (location == UINT32_MAX && ir_location != UINT32_MAX)
		location = ir_location;

	if (storage == StorageClassInput && (has_member_loc_decor || has_var_loc_decor))
	{
		uint32_t component = 0;
		uint32_t orig_mbr_type_id = mbr_type_id;

		if (has_member_loc_decor)
			component = get_member_decoration(var_type.self, mbr_idx, DecorationComponent);

		mbr_type_id = ensure_correct_input_type(mbr_type_id, location, component, 0, meta.strip_array);

		// For members of the composite interface block, we only change the interface block type
		// when interface matching happens. In the meantime, we store the original vector size
		// and insert a swizzle when loading from metal interface block (see fixup below)
		if (mbr_type_id != orig_mbr_type_id)
			orig_vecsize = get<SPIRType>(orig_mbr_type_id).vecsize;

		if (storage == StorageClassInput && pull_model_inputs.count(var.self))
			ib_type.member_types[ib_mbr_idx] = build_msl_interpolant_type(mbr_type_id, is_noperspective);
		else
			ib_type.member_types[ib_mbr_idx] = mbr_type_id;
	}

	bool flatten_stage_out = false;
	string var_chain = var_chain_qual + "." + to_member_name(var_type, mbr_idx);
	if (is_builtin && !meta.strip_array)
	{
		// For the builtin gl_PerVertex, we cannot treat it as a block anyways,
		// so redirect to qualified name.
		set_member_qualified_name(var_type.self, mbr_idx, qual_var_name);
	}
	else if (!meta.strip_array && meta.allow_local_declaration)
	{
		// Unflatten or flatten from [[stage_in]] or [[stage_out]] as appropriate.
		switch (storage)
		{
		case StorageClassInput:
			entry_func.fixup_hooks_in.push_back([=]() {
				string swizzle;
				// Insert swizzle for widened interface block vector from interface matching
				if (orig_vecsize != UINT32_MAX)
					swizzle = vector_swizzle(orig_vecsize, 0);
				statement(var_chain, " = ", qual_var_name, swizzle, ";");
			});
			break;

		case StorageClassOutput:
			flatten_stage_out = true;
			entry_func.fixup_hooks_out.push_back([=]() {
				statement(qual_var_name, " = ", var_chain, ";");
			});
			break;

		default:
			break;
		}
	}

	if ((!is_builtin && location != UINT32_MAX) || (is_builtin && ir_location != UINT32_MAX))
	{
		set_member_decoration(ib_type.self, ib_mbr_idx, DecorationLocation, location);
		mark_location_as_used_by_shader(location, get<SPIRType>(mbr_type_id), storage);
		location += type_to_location_count(get<SPIRType>(mbr_type_id));
	}

	// Copy the component location, if present.
	if (has_member_decoration(var_type.self, mbr_idx, DecorationComponent))
	{
		uint32_t comp = get_member_decoration(var_type.self, mbr_idx, DecorationComponent);
		set_member_decoration(ib_type.self, ib_mbr_idx, DecorationComponent, comp);
	}

	// Mark the member as builtin if needed
	if (is_builtin)
	{
		set_member_decoration(ib_type.self, ib_mbr_idx, DecorationBuiltIn, builtin);
		if (builtin == BuiltInPosition && storage == StorageClassOutput)
			qual_pos_var_name = qual_var_name;
	}

	const SPIRConstant *c = nullptr;
	if (!flatten_stage_out && var.storage == StorageClassOutput &&
	    var.initializer != ID(0) && (c = maybe_get<SPIRConstant>(var.initializer)))
	{
		if (meta.strip_array)
		{
			entry_func.fixup_hooks_in.push_back([=, &var]() {
				auto &type = this->get<SPIRType>(var.basetype);
				uint32_t index = get_extended_member_decoration(var.self, mbr_idx, SPIRVCrossDecorationInterfaceMemberIndex);

				auto invocation = to_tesc_invocation_id();
				auto constant_chain = join(to_expression(var.initializer), "[", invocation, "]");
				statement(to_expression(stage_out_ptr_var_id), "[",
				          invocation, "].",
				          to_member_name(ib_type, index), " = ",
				          constant_chain, ".", to_member_name(type, mbr_idx), ";");
			});
		}
		else
		{
			entry_func.fixup_hooks_in.push_back([=]() {
				statement(qual_var_name, " = ", constant_expression(
						this->get<SPIRConstant>(c->subconstants[mbr_idx])), ";");
			});
		}
	}

	if (storage != StorageClassInput || !pull_model_inputs.count(var.self))
	{
		// Copy interpolation decorations if needed
		if (is_flat)
			set_member_decoration(ib_type.self, ib_mbr_idx, DecorationFlat);
		if (is_noperspective)
			set_member_decoration(ib_type.self, ib_mbr_idx, DecorationNoPerspective);
		if (is_centroid)
			set_member_decoration(ib_type.self, ib_mbr_idx, DecorationCentroid);
		if (is_sample)
			set_member_decoration(ib_type.self, ib_mbr_idx, DecorationSample);
	}

	set_extended_member_decoration(ib_type.self, ib_mbr_idx, SPIRVCrossDecorationInterfaceOrigID, var.self);
	set_extended_member_decoration(ib_type.self, ib_mbr_idx, SPIRVCrossDecorationInterfaceMemberIndex, var_mbr_idx);
}